

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_additive_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                      lyxp_set *set,int options)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 local_a8 [8];
  lyxp_set set2;
  lyxp_set orig_set;
  uint16_t op_exp;
  uint16_t this_op;
  int ret;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  memset(&set2.ctx_pos,0,0x30);
  memset(local_a8,0,0x30);
  orig_set.ctx_size._0_2_ = exp_repeat_peek(exp,*exp_idx);
  if ((((uint16_t)orig_set.ctx_size == 0) ||
      (exp->tokens[(uint16_t)orig_set.ctx_size] != LYXP_TOKEN_OPERATOR_MATH)) ||
     ((exp->expr[exp->expr_pos[(uint16_t)orig_set.ctx_size]] != '+' &&
      (exp->expr[exp->expr_pos[(uint16_t)orig_set.ctx_size]] != '-')))) {
    orig_set.ctx_size._0_2_ = 0;
  }
  else {
    exp_repeat_pop(exp,*exp_idx);
    set_fill_set((lyxp_set *)&set2.ctx_pos,set);
  }
  exp_local._4_4_ = eval_multiplicative_expr(exp,exp_idx,cur_node,param_4,set,options);
  if (exp_local._4_4_ == 0) {
    do {
      while( true ) {
        while( true ) {
          if ((uint16_t)orig_set.ctx_size == 0) {
            lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
            return 0;
          }
          uVar1 = *exp_idx;
          if ('\x02' < ly_log_level) {
            pcVar3 = "skipped";
            if (set != (lyxp_set *)0x0) {
              pcVar3 = "parsed";
            }
            pcVar4 = print_token(exp->tokens[*exp_idx]);
            ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_additive_expr",pcVar3,pcVar4,
                       (ulong)exp->expr_pos[*exp_idx]);
          }
          *exp_idx = *exp_idx + 1;
          orig_set.ctx_size._0_2_ = exp_repeat_peek(exp,*exp_idx);
          if ((((uint16_t)orig_set.ctx_size == 0) ||
              (exp->tokens[(uint16_t)orig_set.ctx_size] != LYXP_TOKEN_OPERATOR_MATH)) ||
             ((exp->expr[exp->expr_pos[(uint16_t)orig_set.ctx_size]] != '+' &&
              (exp->expr[exp->expr_pos[(uint16_t)orig_set.ctx_size]] != '-')))) {
            orig_set.ctx_size._0_2_ = 0;
          }
          else {
            exp_repeat_pop(exp,*exp_idx);
          }
          if (set != (lyxp_set *)0x0) break;
          iVar2 = eval_multiplicative_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
          if (iVar2 != 0) {
            return iVar2;
          }
        }
        set_fill_set((lyxp_set *)local_a8,(lyxp_set *)&set2.ctx_pos);
        iVar2 = eval_multiplicative_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_a8,options);
        if (iVar2 != 0) {
          lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
          lyxp_set_cast((lyxp_set *)local_a8,LYXP_SET_EMPTY,cur_node,param_4,options);
          return iVar2;
        }
        if ((options & 0x1cU) == 0) break;
        set_snode_merge(set,(lyxp_set *)local_a8);
        set_snode_clear_ctx(set);
      }
      iVar2 = moveto_op_math(set,(lyxp_set *)local_a8,exp->expr + exp->expr_pos[uVar1],cur_node,
                             param_4,options);
    } while (iVar2 == 0);
    lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
    lyxp_set_cast((lyxp_set *)local_a8,LYXP_SET_EMPTY,cur_node,param_4,options);
    exp_local._4_4_ = -1;
  }
  else {
    lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
  }
  return exp_local._4_4_;
}

Assistant:

static int
eval_additive_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    int ret;
    uint16_t this_op, op_exp;
    struct lyxp_set orig_set, set2;

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_MATH)
            && ((exp->expr[exp->expr_pos[op_exp]] == '+') || (exp->expr[exp->expr_pos[op_exp]] == '-'))) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* MultiplicativeExpr */
    ret = eval_multiplicative_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('+' / '-' MultiplicativeExpr)* */
    while (op_exp) {
        this_op = *exp_idx;

        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_MATH)
                && ((exp->expr[exp->expr_pos[op_exp]] == '+') || (exp->expr[exp->expr_pos[op_exp]] == '-'))) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_multiplicative_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_multiplicative_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
            set_snode_clear_ctx(set);
        } else {
            if (moveto_op_math(set, &set2, &exp->expr[exp->expr_pos[this_op]], cur_node, local_mod, options)) {
                lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return -1;
            }
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    return EXIT_SUCCESS;
}